

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void parse_line(int nargs,char **args)

{
  char *s;
  uint uVar1;
  ulong uVar2;
  
  s = *args;
  uVar1 = lookup_keyword(s);
  printf("%s(%d)",s,(ulong)uVar1);
  if (1 < nargs) {
    uVar2 = 1;
    do {
      printf(" \'%s\'",args[uVar2]);
      uVar2 = uVar2 + 1;
    } while ((uint)nargs != uVar2);
  }
  putchar(10);
  return;
}

Assistant:

void parse_line(int nargs, char **args)
{
    int n;
    int id = lookup_keyword(args[0]);
    printf("%s(%d)", args[0], id);
    for (n = 1; n < nargs; n++) {
        printf(" '%s'", args[n]);
    }
    printf("\n");
}